

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

PHYSFS_Io * zip_get_io(PHYSFS_Io *io,ZIPinfo *inf,ZIPentry *entry)

{
  int iVar1;
  PHYSFS_Io *io_00;
  ZIPentry *pZVar2;
  
  io_00 = (*io->duplicate)(io);
  if (io_00 != (PHYSFS_Io *)0x0) {
    if ((entry->tree).isdir != 0) {
      __assert_fail("!entry->tree.isdir",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_zip.c"
                    ,0x5e6,"PHYSFS_Io *zip_get_io(PHYSFS_Io *, ZIPinfo *, ZIPentry *)");
    }
    if ((inf == (ZIPinfo *)0x0) || (iVar1 = zip_resolve(io_00,inf,entry), iVar1 != 0)) {
      pZVar2 = entry->symlink;
      if (entry->symlink == (ZIPentry *)0x0) {
        pZVar2 = entry;
      }
      iVar1 = (*io_00->seek)(io_00,pZVar2->offset);
      if (iVar1 != 0) {
        return io_00;
      }
    }
    (*io_00->destroy)(io_00);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *zip_get_io(PHYSFS_Io *io, ZIPinfo *inf, ZIPentry *entry)
{
    int success;
    PHYSFS_Io *retval = io->duplicate(io);
    BAIL_IF_ERRPASS(!retval, NULL);

    assert(!entry->tree.isdir); /* should have been checked before calling. */

    /* (inf) can be NULL if we already resolved. */
    success = (inf == NULL) || zip_resolve(retval, inf, entry);
    if (success)
    {
        PHYSFS_sint64 offset;
        offset = ((entry->symlink) ? entry->symlink->offset : entry->offset);
        success = retval->seek(retval, offset);
    } /* if */

    if (!success)
    {
        retval->destroy(retval);
        retval = NULL;
    } /* if */

    return retval;
}